

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign_x86::forward
          (ROIAlign_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  pointer pMVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  float *pfVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  allocator_type local_161;
  void *local_160;
  ulong local_158;
  void *local_150;
  ulong local_148;
  int local_140;
  float local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_120;
  void *local_118;
  ulong local_110;
  float local_108;
  ulong local_f0;
  long local_e8;
  void *local_e0;
  float local_d4;
  int local_d0;
  float local_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = pMVar5->w;
  iVar15 = pMVar5->h;
  local_120 = (ulong)(uint)pMVar5->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_ROIAlign).pooled_width,(this->super_ROIAlign).pooled_height,
              pMVar5->c,pMVar5->elemsize,opt->blob_allocator);
  lVar17._0_4_ = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    fVar31 = (this->super_ROIAlign).spatial_scale;
    uVar2 = *pMVar5[1].data;
    uVar3 = *(undefined8 *)((long)pMVar5[1].data + 8);
    fVar27 = (float)uVar2 * fVar31;
    fVar28 = (float)((ulong)uVar2 >> 0x20) * fVar31;
    fStack_b0 = fVar31 * 0.0;
    fStack_ac = fVar31 * 0.0;
    auVar26._0_4_ = (float)uVar3 * fVar31 - fVar27;
    auVar26._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar31 - fVar28;
    auVar26._8_4_ = fVar31 * 0.0 - fStack_b0;
    auVar26._12_4_ = fVar31 * 0.0 - fStack_ac;
    if ((this->super_ROIAlign).aligned == true) {
      fVar27 = fVar27 + -0.5;
      fVar28 = fVar28 + -0.5;
      fStack_b0 = fStack_b0 + 0.0;
      fStack_ac = fStack_ac + 0.0;
    }
    else {
      auVar26 = maxps(auVar26,_DAT_005a63e0);
    }
    local_b8 = CONCAT44(fVar28,fVar27);
    lVar17._0_4_ = (this->super_ROIAlign).pooled_width;
    lVar17._4_4_ = (this->super_ROIAlign).pooled_height;
    auVar12._4_4_ = (float)lVar17._4_4_;
    auVar12._0_4_ = (float)(int)lVar17;
    auVar12._8_8_ = 0;
    local_c8 = divps(auVar26,auVar12);
    iVar18 = (this->super_ROIAlign).version;
    fVar31 = local_c8._4_4_;
    if (iVar18 == 1) {
      iVar18 = (this->super_ROIAlign).sampling_ratio;
      local_160 = (void *)CONCAT44(local_160._4_4_,iVar13);
      local_158 = CONCAT44(local_158._4_4_,iVar15);
      if (iVar18 < 1) {
        uStack_130 = 0;
        local_138 = lVar17;
        local_108 = ceilf(fVar31);
        fVar27 = ceilf((float)local_c8._0_4_);
        lVar17._0_4_ = (int)local_138;
        lVar17._4_4_ = local_138._4_4_;
        fVar31 = local_108;
      }
      else {
        fVar27 = (float)iVar18;
        fVar31 = fVar27;
      }
      iVar13 = (int)fVar31;
      iVar15 = (int)fVar27;
      local_138 = (long)iVar15;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)lVar17._4_4_ * (long)(int)lVar17 * local_138 * (long)iVar13,
                 &local_161);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)(float)local_158,(int)local_160._0_4_,(this->super_ROIAlign).pooled_height,
                 (this->super_ROIAlign).pooled_width,iVar13,(int)local_138,local_b8._4_4_,
                 (float)local_b8,(float)local_c8._4_4_,(float)local_c8._0_4_,iVar13,(int)local_138,
                 &pre_calc);
      if (0 < (int)local_120) {
        iVar18 = 1;
        if (1 < iVar15 * iVar13) {
          iVar18 = iVar15 * iVar13;
        }
        local_e0 = pMVar5->data;
        local_e8 = pMVar5->cstep * pMVar5->elemsize;
        local_118 = this_00->data;
        local_b8 = this_00->cstep * this_00->elemsize;
        uVar4 = (this->super_ROIAlign).pooled_width;
        local_158 = (ulong)uVar4;
        fVar31 = (float)(this->super_ROIAlign).pooled_height;
        local_150 = (void *)CONCAT44(local_150._4_4_,fVar31);
        local_110 = (ulong)(int)uVar4;
        local_148 = 0;
        iVar21 = 0;
        if (0 < iVar15) {
          iVar21 = iVar15;
        }
        local_138 = CONCAT44(local_138._4_4_,iVar21 * iVar13);
        do {
          if (0 < (int)fVar31) {
            lVar17 = local_e8 * local_148;
            local_160 = (void *)(local_b8 * local_148 + (long)local_118);
            iVar19 = 0;
            fVar27 = 0.0;
            do {
              local_108 = fVar27;
              if (0 < (int)uVar4) {
                uVar16 = 0;
                do {
                  if (iVar13 < 1) {
                    fVar27 = 0.0;
                  }
                  else {
                    fVar27 = 0.0;
                    iVar14 = 0;
                    iVar22 = iVar19;
                    do {
                      if (0 < iVar15) {
                        pfVar20 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar22].w1;
                        iVar23 = iVar15;
                        do {
                          fVar27 = fVar27 + *(float *)((long)local_e0 +
                                                      (long)(int)pfVar20[-1] * 4 + lVar17) *
                                            pfVar20[3] +
                                            *(float *)((long)local_e0 +
                                                      (long)(int)pfVar20[-3] * 4 + lVar17) *
                                            pfVar20[1] +
                                            *(float *)((long)local_e0 +
                                                      (long)(int)pfVar20[-2] * 4 + lVar17) *
                                            pfVar20[2] +
                                            *(float *)((long)local_e0 +
                                                      (long)((PreCalc<float> *)(pfVar20 + -4))->pos1
                                                      * 4 + lVar17) * *pfVar20;
                          pfVar20 = pfVar20 + 8;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      iVar14 = iVar14 + 1;
                      iVar22 = iVar22 + iVar21;
                    } while (iVar14 != iVar13);
                    iVar19 = iVar19 + iVar21 * iVar13;
                  }
                  *(float *)((long)local_160 + uVar16 * 4) = fVar27 * (1.0 / (float)iVar18);
                  uVar16 = uVar16 + 1;
                } while (uVar16 != local_158);
              }
              local_160 = (void *)((long)local_160 + local_110 * 4);
              fVar27 = (float)((int)local_108 + 1);
            } while ((float)((int)local_108 + 1) != fVar31);
          }
          local_148 = local_148 + 1;
        } while (local_148 != local_120);
      }
    }
    else {
      if (iVar18 != 0) {
        return 0;
      }
      iVar18 = (this->super_ROIAlign).sampling_ratio;
      if (iVar18 < 1) {
        uStack_130 = 0;
        local_138 = lVar17;
        local_108 = ceilf(local_c8._0_4_);
        fVar28 = ceilf(fVar31);
        fVar27 = local_108;
        lVar17._0_4_ = (int)local_138;
        lVar17._4_4_ = local_138._4_4_;
      }
      else {
        fVar28 = (float)iVar18;
        fVar27 = fVar28;
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)lVar17._4_4_ * (long)(int)lVar17 * (long)(int)fVar27 * (long)(int)fVar28,
                 &local_161);
      fVar27 = local_b8._4_4_;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar15,iVar13,(this->super_ROIAlign).pooled_height,
                 (this->super_ROIAlign).pooled_width,local_b8._4_4_,(float)local_b8,fVar31,
                 (float)local_c8._0_4_,(this->super_ROIAlign).sampling_ratio,&pre_calc);
      if (0 < (int)local_120) {
        sVar6 = pMVar5->cstep;
        sVar7 = pMVar5->elemsize;
        pvVar8 = pMVar5->data;
        sVar9 = this_00->cstep;
        sVar10 = this_00->elemsize;
        pvVar11 = this_00->data;
        local_d4 = (float)iVar15;
        uVar4 = (this->super_ROIAlign).pooled_width;
        local_110 = (ulong)uVar4;
        local_13c = (float)iVar13;
        local_140 = (this->super_ROIAlign).pooled_height;
        local_f0 = 0;
        do {
          if (0 < local_140) {
            lVar17 = sVar6 * sVar7 * local_f0;
            iVar13 = (this->super_ROIAlign).sampling_ratio;
            local_e8 = CONCAT44(local_e8._4_4_,iVar13);
            local_150 = (void *)(sVar9 * sVar10 * local_f0 + (long)pvVar11);
            iVar15 = 0;
            iVar18 = 0;
            local_118 = (void *)CONCAT44(local_118._4_4_,(float)iVar13);
            do {
              if ((int)local_110 < 1) {
                iVar15 = iVar15 + 1;
              }
              else {
                fVar28 = (float)iVar15 * fVar31 + fVar27;
                local_d0 = iVar15 + 1;
                fVar29 = (float)local_d0 * fVar31 + fVar27;
                if (fVar28 <= 0.0) {
                  fVar28 = 0.0;
                }
                if (local_d4 <= fVar28) {
                  fVar28 = local_d4;
                }
                if (fVar29 <= 0.0) {
                  fVar29 = 0.0;
                }
                if (local_d4 <= fVar29) {
                  fVar29 = local_d4;
                }
                local_e0 = (void *)CONCAT44(local_e0._4_4_,fVar29);
                local_148 = CONCAT44(local_148._4_4_,fVar28);
                local_cc = ceilf(fVar29 - fVar28);
                uVar16 = 0;
                fVar28 = (float)local_c8._0_4_;
                fVar29 = (float)local_b8;
                fVar33 = local_13c;
                fVar24 = local_118._0_4_;
                do {
                  uVar1 = uVar16 + 1;
                  fVar30 = (float)(int)uVar16 * fVar28 + fVar29;
                  fVar32 = (float)(int)uVar1 * fVar28 + fVar29;
                  if (fVar30 <= 0.0) {
                    fVar30 = 0.0;
                  }
                  if (fVar33 <= fVar30) {
                    fVar30 = fVar33;
                  }
                  if (fVar32 <= 0.0) {
                    fVar32 = 0.0;
                  }
                  if (fVar33 <= fVar32) {
                    fVar32 = fVar33;
                  }
                  fVar34 = fVar24;
                  fVar25 = fVar24;
                  if ((int)local_e8 < 1) {
                    local_160 = (void *)CONCAT44(local_160._4_4_,fVar30);
                    local_158 = CONCAT44(local_158._4_4_,fVar32);
                    fVar24 = ceilf(fVar32 - fVar30);
                    fVar30 = local_160._0_4_;
                    fVar32 = (float)local_158;
                    fVar28 = (float)local_c8._0_4_;
                    fVar29 = (float)local_b8;
                    fVar33 = local_13c;
                    fVar34 = local_118._0_4_;
                    fVar25 = local_cc;
                  }
                  iVar13 = (int)fVar25;
                  iVar15 = (int)fVar24;
                  fVar24 = 0.0;
                  if (iVar13 < 1) {
                    fVar25 = 0.0;
                  }
                  else {
                    local_138 = CONCAT71(local_138._1_7_,fVar32 <= fVar30);
                    iVar19 = 0;
                    iVar21 = 0;
                    if (0 < iVar15) {
                      iVar21 = iVar15;
                    }
                    local_108 = (float)(iVar21 * iVar13);
                    fVar25 = 0.0;
                    local_160 = (void *)CONCAT44(local_160._4_4_,iVar18);
                    iVar22 = iVar18;
                    do {
                      if (0 < iVar15) {
                        pfVar20 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar22].w1;
                        iVar14 = iVar15;
                        do {
                          fVar25 = fVar25 + *(float *)((long)pvVar8 +
                                                      (long)(int)pfVar20[-1] * 4 + lVar17) *
                                            pfVar20[3] +
                                            *(float *)((long)pvVar8 +
                                                      (long)(int)pfVar20[-3] * 4 + lVar17) *
                                            pfVar20[1] +
                                            *(float *)((long)pvVar8 +
                                                      (long)(int)pfVar20[-2] * 4 + lVar17) *
                                            pfVar20[2] +
                                            *(float *)((long)pvVar8 +
                                                      (long)((PreCalc<float> *)(pfVar20 + -4))->pos1
                                                      * 4 + lVar17) * *pfVar20;
                          pfVar20 = pfVar20 + 8;
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                      }
                      iVar19 = iVar19 + 1;
                      iVar22 = iVar22 + iVar21;
                    } while (iVar19 != iVar13);
                    iVar18 = iVar18 + (int)local_108;
                    local_158 = uVar1;
                  }
                  if ((float)local_148 < local_e0._0_4_ && fVar32 > fVar30) {
                    fVar24 = fVar25 / (float)(iVar15 * iVar13);
                  }
                  *(float *)((long)local_150 + uVar16 * 4) = fVar24;
                  uVar16 = uVar1;
                  fVar24 = fVar34;
                  iVar15 = local_d0;
                } while (uVar1 != local_110);
              }
              local_150 = (void *)((long)local_150 + (long)(int)uVar4 * 4);
            } while (iVar15 != local_140);
          }
          local_f0 = local_f0 + 1;
        } while (local_f0 != local_120);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar17._0_4_ = 0;
  }
  return (int)lVar17;
}

Assistant:

int ROIAlign_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}